

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O0

void plutovg_matrix_init_rotate(plutovg_matrix_t *matrix,float angle)

{
  float a;
  float b;
  float s;
  float c;
  float angle_local;
  plutovg_matrix_t *matrix_local;
  
  a = cosf(angle);
  b = sinf(angle);
  plutovg_matrix_init(matrix,a,b,-b,a,0.0,0.0);
  return;
}

Assistant:

void plutovg_matrix_init_rotate(plutovg_matrix_t* matrix, float angle)
{
    float c = cosf(angle);
    float s = sinf(angle);
    plutovg_matrix_init(matrix, c, s, -s, c, 0, 0);
}